

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int main(int argc,char **argv)

{
  instrStruct *local_28;
  instrStruct *element;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    mark("argument error");
    exit(-1);
  }
  globalInit();
  inputFile = (FILE *)fopen(argv[1],"r+");
  compile();
  for (local_28 = firstInstr->next; local_28 != (instrStruct *)0x0; local_28 = local_28->next) {
    fprintf(_stdout,"%d",(ulong)(uint)local_28->instr);
    fprintf(_stdout,"%c",10);
  }
  return 0;
}

Assistant:

procedure 
int main(int argc, char arg[]) {
	variable int i;
	variable struct instrStruct *element;
	i=0;
	if (argc != 2) {
	   mark("argument error");
	   exit(-1);
	}
	globalInit();
	inputFile = fopen(arg);
	compile();

	element = firstInstr->next;
	while (element != NULL) {
		writeInt(element->instr);
		writeChar('\n');
		element = element->next;
	}
}